

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Secret_Input::handle(Fl_Secret_Input *this,int event)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Fl_Window *pFVar14;
  int iVar15;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDX;
  uint p;
  Fl_Boxtype FVar16;
  
  iVar13 = Fl_Input::handle::dnd_save_mark;
  switch(event) {
  case 1:
    bVar6 = Fl::option(OPTION_DND_TEXT);
    if (bVar6) {
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar15 = (this->super_Fl_Input).super_Fl_Input_.position_;
      iVar4 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar16 = (Fl_Boxtype)bVar1;
      iVar11 = Fl::box_dx(FVar16);
      iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar12 = Fl::box_dy((uint)bVar1);
      iVar9 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar7 = Fl::box_dw(FVar16);
      iVar10 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar8 = Fl::box_dh(FVar16);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar13 + iVar11,iVar5 + iVar12,iVar9 - iVar7,iVar10 - iVar8,0);
      Fl_Input::handle::newpos = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input_::position((Fl_Input_ *)this,iVar15,iVar4);
      if ((((Fl::focus_ == (Fl_Widget *)this) && ((Fl::e_state & 0x10000U) == 0)) &&
          (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) != 5)) &&
         (Fl_Input::handle::newpos < (this->super_Fl_Input).super_Fl_Input_.position_ !=
          Fl_Input::handle::newpos < (this->super_Fl_Input).super_Fl_Input_.mark_)) {
        Fl_Input::handle::drag_start = Fl_Input::handle::newpos;
        return 1;
      }
      Fl_Input::handle::drag_start = -1;
    }
    if (Fl::focus_ != (Fl_Widget *)this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    if (Fl::e_keysym == 0xfeea) {
      Fl::e_is_click = 0;
      Fl::paste((Fl_Widget *)this,0);
      goto LAB_001ba06a;
    }
    if (Fl::e_is_click != 0) {
      in_RDX = (EVP_PKEY_CTX *)(ulong)(uint)Fl_Input::handle::drag_start;
      if (-1 < Fl_Input::handle::drag_start) {
        Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::drag_start,
                            Fl_Input::handle::drag_start);
        Fl_Input::handle::drag_start = -1;
        goto LAB_001ba06a;
      }
      if (Fl::e_clicks == 0) goto LAB_001ba06a;
    }
    Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,in_RDX);
LAB_001ba06a:
    if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 8) != 0) {
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_);
    }
    return 1;
  case 3:
  case 4:
  case 7:
    break;
  case 5:
    bVar6 = Fl::option(OPTION_DND_TEXT);
    if ((bVar6) && (-1 < Fl_Input::handle::drag_start)) {
      if (Fl::e_is_click != 0) {
        return 1;
      }
      Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)this;
      Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,src);
      Fl::dnd();
      return 1;
    }
    break;
  case 6:
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar15 = (this->super_Fl_Input).super_Fl_Input_.size_;
      iVar13 = iVar15;
      break;
    case 0xff52:
      iVar13 = Fl_Input_::line_start((Fl_Input_ *)this,(this->super_Fl_Input).super_Fl_Input_.size_)
      ;
      goto LAB_001b9f96;
    case 0xff53:
      iVar13 = 0;
LAB_001b9f73:
      iVar15 = 0;
      break;
    case 0xff54:
      iVar13 = 0;
LAB_001b9f96:
      Fl_Input_::up_down_position((Fl_Input_ *)this,iVar13,0);
      goto switchD_001b9adf_caseD_3;
    default:
      if (Fl::e_keysym == 0xff09) {
        iVar13 = (this->super_Fl_Input).super_Fl_Input_.size_;
        goto LAB_001b9f73;
      }
      iVar15 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.position_;
    }
    Fl_Input_::position((Fl_Input_ *)this,iVar13,iVar15);
    break;
  case 8:
    if ((((Fl::e_keysym == 0xff09) &&
         ((Fl::e_state & 0x10000U) == 0 && (this->super_Fl_Input).super_Fl_Input_.tab_nav_ == 0)) &&
        (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) == 4)) &&
       (uVar2 = (this->super_Fl_Input).super_Fl_Input_.size_, 0 < (int)uVar2)) {
      p = (this->super_Fl_Input).super_Fl_Input_.position_;
      uVar3 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      if ((p == uVar2 && uVar3 == 0) || (uVar2 == uVar3 && p == 0)) {
        if (p < uVar3) {
          p = uVar3;
        }
        Fl_Input_::position((Fl_Input_ *)this,p,p);
        return 1;
      }
    }
    iVar13 = Fl_Widget::active_r((Fl_Widget *)this);
    if (((iVar13 != 0) &&
        (pFVar14 = Fl_Widget::window((Fl_Widget *)this), pFVar14 != (Fl_Window *)0x0)) &&
       (Fl::belowmouse_ == (Fl_Widget *)this)) {
      pFVar14 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar14,FL_CURSOR_NONE);
    }
    iVar13 = Fl_Input::handle_key(&this->super_Fl_Input);
    return iVar13;
  default:
    switch(event) {
    case 0x14:
      Fl::belowmouse((Fl_Widget *)this);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this) {
        Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
        Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
        Fl_Input::handle::dnd_save_focus = Fl::focus_;
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
    case 0x15:
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar16 = (Fl_Boxtype)bVar1;
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar9 = Fl::box_dx(FVar16);
      iVar15 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar10 = Fl::box_dy((uint)bVar1);
      iVar4 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar11 = Fl::box_dw(FVar16);
      iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar12 = Fl::box_dh(FVar16);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar13 + iVar9,iVar15 + iVar10,iVar4 - iVar11,iVar5 - iVar12,0);
      return 1;
    case 0x16:
      Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::dnd_save_position,
                          Fl_Input::handle::dnd_save_mark);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this &&
          Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        Fl::focus(Fl_Input::handle::dnd_save_focus);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,7);
      }
      pFVar14 = Fl::first_window();
      Fl_Window::cursor(pFVar14,FL_CURSOR_MOVE);
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      return 1;
    case 0x17:
      if (Fl_Input::handle::dnd_save_focus == (Fl_Widget *)this) {
        iVar15 = (this->super_Fl_Input).super_Fl_Input_.position_;
        if (Fl_Input::handle::dnd_save_position < Fl_Input::handle::dnd_save_mark) {
          Fl_Input::handle::dnd_save_mark = Fl_Input::handle::dnd_save_position;
          Fl_Input::handle::dnd_save_position = iVar13;
        }
        Fl_Input_::replace((Fl_Input_ *)this,Fl_Input::handle::dnd_save_mark,
                           Fl_Input::handle::dnd_save_position,(char *)0x0,0);
        if (Fl_Input::handle::dnd_save_position < iVar15) {
          iVar15 = (Fl_Input::handle::dnd_save_mark - Fl_Input::handle::dnd_save_position) + iVar15;
        }
        Fl_Input_::position((Fl_Input_ *)this,iVar15,iVar15);
      }
      else if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        (*Fl_Input::handle::dnd_save_focus->_vptr_Fl_Widget[3])(Fl_Input::handle::dnd_save_focus,7);
      }
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      Fl_Widget::take_focus((Fl_Widget *)this);
      return 1;
    }
  }
switchD_001b9adf_caseD_3:
  bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
  FVar16 = (Fl_Boxtype)bVar1;
  iVar13 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
  iVar9 = Fl::box_dx(FVar16);
  iVar15 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
  iVar10 = Fl::box_dy((uint)bVar1);
  iVar4 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  iVar11 = Fl::box_dw(FVar16);
  iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
  iVar12 = Fl::box_dh(FVar16);
  iVar13 = Fl_Input_::handletext
                     ((Fl_Input_ *)this,event,iVar13 + iVar9,iVar15 + iVar10,iVar4 - iVar11,
                      iVar5 - iVar12);
  return iVar13;
}

Assistant:

int Fl_Secret_Input::handle(int event) {
  int retval = Fl_Input::handle(event);
#ifdef __APPLE__
  if (event == FL_KEYBOARD && Fl::compose_state) {
    this->mark( this->position() ); // don't underline marked text
  }
#endif
  return retval;
}